

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void glfwSetGamma(GLFWmonitor *handle,float gamma)

{
  GLFWgammaramp *pGVar1;
  float fVar2;
  float value;
  GLFWgammaramp *original;
  GLFWgammaramp ramp;
  unsigned_short *values;
  uint i;
  float gamma_local;
  GLFWmonitor *handle_local;
  
  if (handle == (GLFWmonitor *)0x0) {
    __assert_fail("handle != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GordaNN[P]voxel_game/project/third-party/glfw-3.3.1/src/monitor.c"
                  ,0x1cd,"void glfwSetGamma(GLFWmonitor *, float)");
  }
  if (gamma <= 0.0) {
    __assert_fail("gamma > 0.f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GordaNN[P]voxel_game/project/third-party/glfw-3.3.1/src/monitor.c"
                  ,0x1ce,"void glfwSetGamma(GLFWmonitor *, float)");
  }
  if (3.4028235e+38 < gamma) {
    __assert_fail("gamma <= FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GordaNN[P]voxel_game/project/third-party/glfw-3.3.1/src/monitor.c"
                  ,0x1cf,"void glfwSetGamma(GLFWmonitor *, float)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((gamma <= 0.0) || (3.4028235e+38 < gamma)) {
    _glfwInputError(0x10004,"Invalid gamma value %f",(double)gamma);
  }
  else {
    pGVar1 = glfwGetGammaRamp(handle);
    if (pGVar1 != (GLFWgammaramp *)0x0) {
      ramp._24_8_ = calloc((ulong)pGVar1->size,2);
      for (values._0_4_ = 0; (uint)values < pGVar1->size; values._0_4_ = (uint)values + 1) {
        fVar2 = powf((float)(uint)values / (float)(pGVar1->size - 1),1.0 / gamma);
        fVar2 = _glfw_fminf(fVar2 * 65535.0 + 0.5,65535.0);
        *(short *)(ramp._24_8_ + (ulong)(uint)values * 2) = (short)(int)fVar2;
      }
      original = (GLFWgammaramp *)ramp._24_8_;
      ramp.red = (unsigned_short *)ramp._24_8_;
      ramp.green = (unsigned_short *)ramp._24_8_;
      ramp.blue._0_4_ = pGVar1->size;
      glfwSetGammaRamp(handle,(GLFWgammaramp *)&original);
      free((void *)ramp._24_8_);
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwSetGamma(GLFWmonitor* handle, float gamma)
{
    unsigned int i;
    unsigned short* values;
    GLFWgammaramp ramp;
    const GLFWgammaramp* original;
    assert(handle != NULL);
    assert(gamma > 0.f);
    assert(gamma <= FLT_MAX);

    _GLFW_REQUIRE_INIT();

    if (gamma != gamma || gamma <= 0.f || gamma > FLT_MAX)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid gamma value %f", gamma);
        return;
    }

    original = glfwGetGammaRamp(handle);
    if (!original)
        return;

    values = calloc(original->size, sizeof(unsigned short));

    for (i = 0;  i < original->size;  i++)
    {
        float value;

        // Calculate intensity
        value = i / (float) (original->size - 1);
        // Apply gamma curve
        value = powf(value, 1.f / gamma) * 65535.f + 0.5f;
        // Clamp to value range
        value = _glfw_fminf(value, 65535.f);

        values[i] = (unsigned short) value;
    }

    ramp.red = values;
    ramp.green = values;
    ramp.blue = values;
    ramp.size = original->size;

    glfwSetGammaRamp(handle, &ramp);
    free(values);
}